

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O3

void luaF_close(lua_State *L,StkId level)

{
  UpVal *uv;
  TValue *pTVar1;
  undefined8 uVar2;
  TValue *io1;
  
  uv = L->openupval;
  while ((uv != (UpVal *)0x0 && (pTVar1 = uv->v, level <= pTVar1))) {
    L->openupval = (uv->u).open.next;
    if (uv->refcount == 0) {
      luaM_realloc_(L,uv,0x20,0);
    }
    else {
      uVar2 = *(undefined8 *)&pTVar1->tt_;
      (uv->u).open.next = (UpVal *)pTVar1->value_;
      *(undefined8 *)((long)&uv->u + 8) = uVar2;
      uv->v = (TValue *)&uv->u;
      if ((undefined1  [16])((undefined1  [16])uv->u & (undefined1  [16])0x40) !=
          (undefined1  [16])0x0) {
        luaC_upvalbarrier_(L,uv);
      }
    }
    uv = L->openupval;
  }
  return;
}

Assistant:

void luaF_close (lua_State *L, StkId level) {
  UpVal *uv;
  while (L->openupval != NULL && (uv = L->openupval)->v >= level) {
    lua_assert(upisopen(uv));
    L->openupval = uv->u.open.next;  /* remove from 'open' list */
    if (uv->refcount == 0)  /* no references? */
      luaM_free(L, uv);  /* free upvalue */
    else {
      setobj(L, &uv->u.value, uv->v);  /* move value to upvalue slot */
      uv->v = &uv->u.value;  /* now current value lives here */
      luaC_upvalbarrier(L, uv);
    }
  }
}